

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommaInitializer.h
# Opt level: O3

CommaInitializer<Eigen::IndexedView<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_Eigen::internal::SingleRange>_>
* __thiscall
Eigen::
CommaInitializer<Eigen::IndexedView<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_Eigen::internal::SingleRange>_>
::operator_(CommaInitializer<Eigen::IndexedView<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_Eigen::internal::SingleRange>_>
            *this,Scalar *s)

{
  Scalar SVar1;
  IndexedView<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_Eigen::internal::SingleRange>
  *pIVar2;
  long lVar3;
  long lVar4;
  
  lVar4 = this->m_col;
  if (lVar4 == 1) {
    lVar4 = this->m_row + this->m_currentBlockRows;
    this->m_row = lVar4;
    this->m_col = 0;
    this->m_currentBlockRows = 1;
    if ((this->m_xpr->m_rowIndices).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
        m_storage.m_rows <= lVar4) {
      __assert_fail("m_row<m_xpr.rows() && \"Too many rows passed to comma initializer (operator<<)\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/CommaInitializer.h"
                    ,0x49,
                    "CommaInitializer<MatrixType> &Eigen::CommaInitializer<Eigen::IndexedView<Eigen::Matrix<double, -1, 1>, Eigen::Matrix<int, -1, 1>, Eigen::internal::SingleRange>>::operator,(const Scalar &) [MatrixType = Eigen::IndexedView<Eigen::Matrix<double, -1, 1>, Eigen::Matrix<int, -1, 1>, Eigen::internal::SingleRange>]"
                   );
    }
    lVar4 = 0;
  }
  else if (0 < lVar4) {
    __assert_fail("m_col<m_xpr.cols() && \"Too many coefficients passed to comma initializer (operator<<)\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/CommaInitializer.h"
                  ,0x4c,
                  "CommaInitializer<MatrixType> &Eigen::CommaInitializer<Eigen::IndexedView<Eigen::Matrix<double, -1, 1>, Eigen::Matrix<int, -1, 1>, Eigen::internal::SingleRange>>::operator,(const Scalar &) [MatrixType = Eigen::IndexedView<Eigen::Matrix<double, -1, 1>, Eigen::Matrix<int, -1, 1>, Eigen::internal::SingleRange>]"
                 );
  }
  if (this->m_currentBlockRows == 1) {
    SVar1 = *s;
    pIVar2 = this->m_xpr;
    lVar3 = this->m_row;
    this->m_col = lVar4 + 1;
    if ((-1 < lVar3) &&
       (lVar3 < (pIVar2->m_rowIndices).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                m_storage.m_rows)) {
      (pIVar2->m_xpr->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
      m_data[(pIVar2->m_rowIndices).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
             m_storage.m_data[lVar3]] = SVar1;
      return this;
    }
    __assert_fail("index >= 0 && index < size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/DenseCoeffsBase.h"
                  ,0xa3,
                  "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<int, -1, 1>, 0>::operator[](Index) const [Derived = Eigen::Matrix<int, -1, 1>, Level = 0]"
                 );
  }
  __assert_fail("m_currentBlockRows==1",
                "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/CommaInitializer.h"
                ,0x4d,
                "CommaInitializer<MatrixType> &Eigen::CommaInitializer<Eigen::IndexedView<Eigen::Matrix<double, -1, 1>, Eigen::Matrix<int, -1, 1>, Eigen::internal::SingleRange>>::operator,(const Scalar &) [MatrixType = Eigen::IndexedView<Eigen::Matrix<double, -1, 1>, Eigen::Matrix<int, -1, 1>, Eigen::internal::SingleRange>]"
               );
}

Assistant:

EIGEN_DEVICE_FUNC
  CommaInitializer& operator,(const Scalar& s)
  {
    if (m_col==m_xpr.cols())
    {
      m_row+=m_currentBlockRows;
      m_col = 0;
      m_currentBlockRows = 1;
      eigen_assert(m_row<m_xpr.rows()
        && "Too many rows passed to comma initializer (operator<<)");
    }
    eigen_assert(m_col<m_xpr.cols()
      && "Too many coefficients passed to comma initializer (operator<<)");
    eigen_assert(m_currentBlockRows==1);
    m_xpr.coeffRef(m_row, m_col++) = s;
    return *this;
  }